

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

int __thiscall
CTextRender::LoadFontCollection(CTextRender *this,void *pFilename,void *pBuf,long FileSize)

{
  FT_Long FVar1;
  CGlyphMap *pCVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  FT_Face_conflict FtFace;
  FT_Face_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = FT_New_Memory_Face(this->m_FTLibrary,pBuf,FileSize,0xffffffffffffffff,&local_40);
  iVar5 = -1;
  if (iVar3 == 0) {
    FVar1 = local_40->num_faces;
    FT_Done_Face();
    iVar5 = 0;
    uVar6 = 0;
    uVar4 = (uint)FVar1;
    if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        iVar3 = FT_New_Memory_Face(this->m_FTLibrary,pBuf,FileSize,uVar6,&local_40);
        if (iVar3 != 0) {
LAB_00131c25:
          FT_Done_Face(local_40);
          break;
        }
        pCVar2 = this->m_pGlyphMap;
        iVar3 = pCVar2->m_NumFtFaces;
        if ((long)iVar3 == 0x10) goto LAB_00131c25;
        pCVar2->m_NumFtFaces = iVar3 + 1;
        pCVar2->m_aFtFaces[iVar3] = local_40;
        if (pCVar2->m_DefaultFace == (FT_Face_conflict)0x0) {
          pCVar2->m_DefaultFace = local_40;
        }
        if (iVar3 == 0x10) goto LAB_00131c25;
        uVar6 = uVar6 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar6);
    }
    dbg_msg("textrender","loaded %d faces from font file \'%s\'",uVar6 & 0xffffffff,pFilename);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int CTextRender::LoadFontCollection(const void *pFilename, const void *pBuf, long FileSize)
{
	FT_Face FtFace;

	if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, -1, &FtFace))
		return -1;

	int NumFaces = FtFace->num_faces;
	FT_Done_Face(FtFace);

	int i;
	for(i = 0; i < NumFaces; ++i)
	{
		if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, i, &FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}

		if(m_pGlyphMap->AddFace(FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}
	}

	dbg_msg("textrender", "loaded %d faces from font file '%s'", i, (char *)pFilename);

	return 0;
}